

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to-renderscene-main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  string *psVar6;
  size_type sVar7;
  reference pvVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a00;
  ostream local_2900 [8];
  ofstream ofs;
  undefined1 local_2700 [8];
  string usda_str;
  undefined1 local_26c0 [8];
  string usd_filename;
  string usd_basename;
  string ext;
  ofstream mtl_ofs;
  ostream local_2460 [8];
  ofstream obj_ofs;
  string local_2260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2240;
  undefined1 local_2220 [8];
  string mtl_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e0;
  undefined1 local_21c0 [8];
  string obj_filename;
  string mtl_str;
  string obj_str;
  size_t i_1;
  string local_2150;
  string local_2130;
  TimeCode local_2110;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20f8;
  iterator local_20d8;
  size_type local_20d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20c8;
  undefined1 local_20b0 [8];
  AssetResolutionResolver arr;
  USDZAsset usdz_asset;
  string usd_basedir;
  RenderSceneConverterEnv env;
  RenderSceneConverter converter;
  RenderScene render_scene;
  string s;
  undefined1 auStack_1798 [7];
  bool is_usdz;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_1770;
  undefined8 uStack_1740;
  byte local_1731;
  undefined1 local_1730 [7];
  bool ret;
  Stage stage;
  string err;
  string warn;
  string local_80;
  undefined4 local_60;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  string filepath;
  bool no_usdprint;
  bool export_usd;
  bool export_obj;
  bool triangulate;
  Stage *pSStack_20;
  bool build_indices;
  double timecode;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," input.usd [OPTIONS].\n");
    std::operator<<((ostream *)&std::cout,"\n\nOptions\n\n");
    std::operator<<((ostream *)&std::cout,"  --timecode VALUE: Specify timecode value(e.g. 3.14)\n")
    ;
    std::operator<<((ostream *)&std::cout,"  --noidxbuild: Do not rebuild vertex indices\n");
    std::operator<<((ostream *)&std::cout,"  --notri: Do not triangulate mesh\n");
    std::operator<<((ostream *)&std::cout,"  --nousdprint: Do not print parsed USD\n");
    std::operator<<((ostream *)&std::cout,
                    "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n");
    std::operator<<((ostream *)&std::cout,"  --dumpusd: Dump scene as USD(USDA Ascii)\n");
    argv_local._4_4_ = 1;
  }
  else {
    pSStack_20 = (Stage *)tinyusdz::value::TimeCode::Default();
    filepath.field_2._M_local_buf[0xf] = '\x01';
    filepath.field_2._M_local_buf[0xe] = '\x01';
    filepath.field_2._M_local_buf[0xd] = '\0';
    filepath.field_2._M_local_buf[0xc] = '\0';
    filepath.field_2._M_local_buf[0xb] = '\0';
    std::__cxx11::string::string((string *)local_48);
    for (local_4c = 1; local_4c < argc; local_4c = local_4c + 1) {
      iVar2 = strcmp(argv[local_4c],"--notri");
      if (iVar2 == 0) {
        filepath.field_2._M_local_buf[0xe] = '\0';
      }
      else {
        iVar2 = strcmp(argv[local_4c],"--noidxbuild");
        if (iVar2 == 0) {
          filepath.field_2._M_local_buf[0xf] = '\0';
        }
        else {
          iVar2 = strcmp(argv[local_4c],"--nousdprint");
          if (iVar2 == 0) {
            filepath.field_2._M_local_buf[0xb] = '\x01';
          }
          else {
            iVar2 = strcmp(argv[local_4c],"--dumpobj");
            if (iVar2 == 0) {
              filepath.field_2._M_local_buf[0xd] = '\x01';
            }
            else {
              iVar2 = strcmp(argv[local_4c],"--dumpusd");
              if (iVar2 == 0) {
                filepath.field_2._M_local_buf[0xc] = '\x01';
              }
              else {
                iVar2 = strcmp(argv[local_4c],"--timecode");
                if (iVar2 == 0) {
                  if (argc <= local_4c + 1) {
                    std::operator<<((ostream *)&std::cerr,"arg is missing for --timecode flag.\n");
                    argv_local._4_4_ = -1;
                    local_60 = 1;
                    goto LAB_001297e1;
                  }
                  pcVar9 = argv[(long)local_4c + 1];
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_80,pcVar9,
                             (allocator *)(warn.field_2._M_local_buf + 0xf));
                  pSStack_20 = (Stage *)std::__cxx11::stod(&local_80,(size_t *)0x0);
                  std::__cxx11::string::~string((string *)&local_80);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(warn.field_2._M_local_buf + 0xf));
                  poVar3 = std::operator<<((ostream *)&std::cout,"Use timecode: ");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)pSStack_20);
                  std::operator<<(poVar3,"\n");
                  local_4c = local_4c + 1;
                }
                else {
                  std::__cxx11::string::operator=((string *)local_48,argv[local_4c]);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&stage._prim_id_allocator.dirty_);
    tinyusdz::Stage::Stage((Stage *)local_1730);
    bVar1 = tinyusdz::IsUSD((string *)local_48,(string *)0x0);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"File not found or not a USD format: ");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      std::operator<<(poVar3,"\n");
    }
    _Stack_1770.super__Rb_tree_header._M_node_count = 0;
    uStack_1740._0_4_ = X;
    uStack_1740._4_4_ = 0;
    _Stack_1770.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    _Stack_1770.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    _Stack_1770.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_1770.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_1770.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1778._0_1_ = false;
    local_1778._1_1_ = false;
    local_1778._2_1_ = false;
    local_1778._3_5_ = 0;
    _Stack_1770._0_8_ = 0;
    local_1788._0_4_ = 0;
    local_1788._4_4_ = 0;
    uStack_1780._0_4_ = 0;
    uStack_1780._4_4_ = 0;
    auStack_1798._0_4_ = 0;
    stack0xffffffffffffe86c = 0;
    uStack_1790._0_1_ = false;
    uStack_1790._1_1_ = false;
    uStack_1790._2_1_ = false;
    uStack_1790._3_1_ = false;
    uStack_1790._4_1_ = false;
    uStack_1790._5_3_ = 0;
    tinyusdz::USDLoadOptions::USDLoadOptions((USDLoadOptions *)auStack_1798);
    bVar1 = tinyusdz::LoadUSDFromFile
                      ((string *)local_48,(Stage *)local_1730,
                       (string *)(err.field_2._M_local_buf + 8),
                       (string *)&stage._prim_id_allocator.dirty_,(USDLoadOptions *)auStack_1798);
    tinyusdz::USDLoadOptions::~USDLoadOptions((USDLoadOptions *)auStack_1798);
    local_1731 = bVar1;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"WARN : ");
      poVar3 = std::operator<<(poVar3,(string *)(err.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"\n");
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERR : ");
      poVar3 = std::operator<<(poVar3,(string *)&stage._prim_id_allocator.dirty_);
      std::operator<<(poVar3,"\n");
    }
    if ((local_1731 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to load USD file: ");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      std::operator<<(poVar3,"\n");
      argv_local._4_4_ = 1;
      local_60 = 1;
    }
    else {
      bVar1 = tinyusdz::IsUSDZ((string *)local_48);
      if ((filepath.field_2._M_local_buf[0xb] & 1U) == 0) {
        tinyusdz::Stage::ExportToString_abi_cxx11_
                  ((string *)
                   &render_scene.buffers.
                    super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Stage *)local_1730,false);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 &render_scene.buffers.
                                  super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<((ostream *)&std::cout,"--------------------------------------");
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string
                  ((string *)
                   &render_scene.buffers.
                    super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      tinyusdz::tydra::RenderScene::RenderScene((RenderScene *)((long)&converter._warn.field_2 + 8))
      ;
      tinyusdz::tydra::RenderSceneConverter::RenderSceneConverter
                ((RenderSceneConverter *)&env.tinterp);
      tinyusdz::tydra::RenderSceneConverterEnv::RenderSceneConverterEnv
                ((RenderSceneConverterEnv *)((long)&usd_basedir.field_2 + 8),(Stage *)local_1730);
      poVar3 = std::operator<<((ostream *)&std::cout,"Triangulate : ");
      pcVar9 = "false";
      if ((filepath.field_2._M_local_buf[0xe] & 1U) != 0) {
        pcVar9 = "true";
      }
      poVar3 = std::operator<<(poVar3,pcVar9);
      std::operator<<(poVar3,"\n");
      env.scene_config.load_texture_assets = (bool)(filepath.field_2._M_local_buf[0xe] & 1);
      poVar3 = std::operator<<((ostream *)&std::cout,"Rebuild vertex indices : ");
      pcVar9 = "false";
      if ((filepath.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar9 = "true";
      }
      poVar3 = std::operator<<(poVar3,pcVar9);
      std::operator<<(poVar3,"\n");
      env.mesh_config.default_binormals_primvar_name.field_2._M_local_buf[0xc] =
           filepath.field_2._M_local_buf[0xf] & 1;
      tinyusdz::io::GetBaseDir((string *)&usdz_asset.size,(string *)local_48);
      poVar3 = std::operator<<((ostream *)&std::cout,"Add seach path: ");
      poVar3 = std::operator<<(poVar3,(string *)&usdz_asset.size);
      std::operator<<(poVar3,"\n");
      tinyusdz::USDZAsset::USDZAsset
                ((USDZAsset *)
                 &arr._asset_resolution_handlers._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar1) {
        bVar1 = tinyusdz::ReadUSDZAssetInfoFromFile
                          ((string *)local_48,
                           (USDZAsset *)
                           &arr._asset_resolution_handlers._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(string *)(err.field_2._M_local_buf + 8),
                           (string *)&stage._prim_id_allocator.dirty_,0x4000);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to read USDZ assetInfo from file: "
                                  );
          poVar3 = std::operator<<(poVar3,(string *)&stage._prim_id_allocator.dirty_);
          std::operator<<(poVar3,"\n");
          exit(-1);
        }
        lVar5 = std::__cxx11::string::size();
        if (lVar5 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)(err.field_2._M_local_buf + 8));
          std::operator<<(poVar3,"\n");
        }
        tinyusdz::AssetResolutionResolver::AssetResolutionResolver
                  ((AssetResolutionResolver *)local_20b0);
        bVar1 = tinyusdz::SetupUSDZAssetResolution
                          ((AssetResolutionResolver *)local_20b0,
                           (USDZAsset *)
                           &arr._asset_resolution_handlers._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
        if (!bVar1) {
          std::operator<<((ostream *)&std::cerr,"Failed to setup AssetResolution for USDZ asset\n");
          exit(-1);
        }
        tinyusdz::AssetResolutionResolver::operator=
                  ((AssetResolutionResolver *)&env.material_config.allow_backslash_in_asset_path,
                   (AssetResolutionResolver *)local_20b0);
        tinyusdz::AssetResolutionResolver::~AssetResolutionResolver
                  ((AssetResolutionResolver *)local_20b0);
      }
      else {
        local_2100 = &local_20f8;
        std::__cxx11::string::string((string *)local_2100,(string *)&usdz_asset.size);
        local_20d8 = &local_20f8;
        local_20d0 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_2101);
        __l._M_len = local_20d0;
        __l._M_array = local_20d8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_20c8,__l,&local_2101);
        tinyusdz::tydra::RenderSceneConverterEnv::set_search_paths
                  ((RenderSceneConverterEnv *)((long)&usd_basedir.field_2 + 8),&local_20c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_20c8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_2101);
        local_2a00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_20d8;
        do {
          local_2a00 = local_2a00 + -1;
          std::__cxx11::string::~string((string *)local_2a00);
        } while (local_2a00 != &local_20f8);
      }
      tinyusdz::value::TimeCode::TimeCode(&local_2110,(double)pSStack_20);
      bVar1 = tinyusdz::value::TimeCode::is_default(&local_2110);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Use timecode : ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)pSStack_20);
        std::operator<<(poVar3,"\n");
      }
      env.stage = pSStack_20;
      local_1731 = tinyusdz::tydra::RenderSceneConverter::ConvertToRenderScene
                             ((RenderSceneConverter *)&env.tinterp,
                              (RenderSceneConverterEnv *)((long)&usd_basedir.field_2 + 8),
                              (RenderScene *)((long)&converter._warn.field_2 + 8));
      if ((bool)local_1731) {
        tinyusdz::tydra::RenderSceneConverter::GetWarning_abi_cxx11_
                  ((RenderSceneConverter *)&env.tinterp);
        lVar5 = std::__cxx11::string::size();
        if (lVar5 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"ConvertToRenderScene warn: ");
          psVar6 = tinyusdz::tydra::RenderSceneConverter::GetWarning_abi_cxx11_
                             ((RenderSceneConverter *)&env.tinterp);
          poVar3 = std::operator<<(poVar3,(string *)psVar6);
          std::operator<<(poVar3,"\n");
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2150,"kdl",(allocator *)((long)&i_1 + 7));
        tinyusdz::tydra::DumpRenderScene
                  (&local_2130,(RenderScene *)((long)&converter._warn.field_2 + 8),&local_2150);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_2130);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_2130);
        std::__cxx11::string::~string((string *)&local_2150);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
        if ((filepath.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::operator<<((ostream *)&std::cout,"Dump RenderMesh as wavefront .obj\n");
          for (obj_str.field_2._8_8_ = 0;
              sVar7 = std::
                      vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                      ::size((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                              *)&render_scene.textures.
                                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage),
              (ulong)obj_str.field_2._8_8_ < sVar7;
              obj_str.field_2._8_8_ = obj_str.field_2._8_8_ + 1) {
            std::__cxx11::string::string((string *)(mtl_str.field_2._M_local_buf + 8));
            std::__cxx11::string::string((string *)(obj_filename.field_2._M_local_buf + 8));
            bVar1 = tinyusdz::tydra::export_to_obj
                              ((RenderScene *)((long)&converter._warn.field_2 + 8),
                               obj_str.field_2._8_4_,(string *)(mtl_str.field_2._M_local_buf + 8),
                               (string *)(obj_filename.field_2._M_local_buf + 8),
                               (string *)((long)&err.field_2 + 8),
                               (string *)&stage._prim_id_allocator.dirty_);
            if (!bVar1) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"obj export error: ");
              poVar3 = std::operator<<(poVar3,(string *)&stage._prim_id_allocator.dirty_);
              std::operator<<(poVar3,"\n");
              exit(-1);
            }
            std::__cxx11::to_string
                      ((string *)((long)&mtl_filename.field_2 + 8),obj_str.field_2._8_8_);
            pvVar8 = std::
                     vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                     ::operator[]((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                   *)&render_scene.textures.
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  obj_str.field_2._8_8_);
            std::operator+(&local_21e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&mtl_filename.field_2 + 8),&pvVar8->prim_name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_21c0,&local_21e0,".obj");
            std::__cxx11::string::~string((string *)&local_21e0);
            std::__cxx11::string::~string((string *)(mtl_filename.field_2._M_local_buf + 8));
            std::__cxx11::to_string(&local_2260,obj_str.field_2._8_8_);
            pvVar8 = std::
                     vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                     ::operator[]((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                   *)&render_scene.textures.
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  obj_str.field_2._8_8_);
            std::operator+(&local_2240,&local_2260,&pvVar8->prim_name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2220,&local_2240,".mtl");
            std::__cxx11::string::~string((string *)&local_2240);
            std::__cxx11::string::~string((string *)&local_2260);
            std::ofstream::ofstream(local_2460,(string *)local_21c0,_S_out);
            std::operator<<(local_2460,(string *)(mtl_str.field_2._M_local_buf + 8));
            std::ofstream::~ofstream(local_2460);
            std::ofstream::ofstream((void *)((long)&ext.field_2 + 8),(string *)local_2220,_S_out);
            std::operator<<((ostream *)(ext.field_2._M_local_buf + 8),
                            (string *)(obj_filename.field_2._M_local_buf + 8));
            std::ofstream::~ofstream((void *)((long)&ext.field_2 + 8));
            poVar3 = std::operator<<((ostream *)&std::cout,"  Wrote ");
            poVar3 = std::operator<<(poVar3,(string *)local_21c0);
            std::operator<<(poVar3,"\n");
            std::__cxx11::string::~string((string *)local_2220);
            std::__cxx11::string::~string((string *)local_21c0);
            std::__cxx11::string::~string((string *)(obj_filename.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(mtl_str.field_2._M_local_buf + 8));
          }
        }
        if ((filepath.field_2._M_local_buf[0xc] & 1U) != 0) {
          tinyusdz::io::GetFileExtension
                    ((string *)((long)&usd_basename.field_2 + 8),(string *)local_48);
          tinyusdz::io::GetBaseFilename
                    ((string *)((long)&usd_filename.field_2 + 8),(string *)local_48);
          tinyusdz::removeSuffix
                    ((string *)((long)&usda_str.field_2 + 8),
                     (string *)((long)&usd_filename.field_2 + 8),
                     (string *)((long)&usd_basename.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_26c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&usda_str.field_2 + 8),"export.usda");
          std::__cxx11::string::~string((string *)(usda_str.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_2700);
          bVar1 = tinyusdz::tydra::export_to_usda
                            ((RenderScene *)((long)&converter._warn.field_2 + 8),
                             (string *)local_2700,(string *)((long)&err.field_2 + 8),
                             (string *)&stage._prim_id_allocator.dirty_);
          if (!bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to export RenderScene to USDA: ")
            ;
            poVar3 = std::operator<<(poVar3,(string *)&stage._prim_id_allocator.dirty_);
            std::operator<<(poVar3,"\n");
          }
          lVar5 = std::__cxx11::string::size();
          if (lVar5 != 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"WARN: ");
            poVar3 = std::operator<<(poVar3,(string *)(err.field_2._M_local_buf + 8));
            std::operator<<(poVar3,"\n");
          }
          std::ofstream::ofstream(local_2900,(string *)local_26c0,_S_out);
          std::operator<<(local_2900,(string *)local_2700);
          std::ofstream::~ofstream(local_2900);
          poVar3 = std::operator<<((ostream *)&std::cout,"Exported RenderScene as USDA: ");
          poVar3 = std::operator<<(poVar3,(string *)local_26c0);
          std::operator<<(poVar3,"\n");
          std::__cxx11::string::~string((string *)local_2700);
          std::__cxx11::string::~string((string *)local_26c0);
          std::__cxx11::string::~string((string *)(usd_filename.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(usd_basename.field_2._M_local_buf + 8));
        }
        argv_local._4_4_ = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Failed to convert USD Stage to RenderScene: \n");
        psVar6 = tinyusdz::tydra::RenderSceneConverter::GetError_abi_cxx11_
                           ((RenderSceneConverter *)&env.tinterp);
        poVar3 = std::operator<<(poVar3,(string *)psVar6);
        std::operator<<(poVar3,"\n");
        argv_local._4_4_ = 1;
      }
      local_60 = 1;
      tinyusdz::USDZAsset::~USDZAsset
                ((USDZAsset *)
                 &arr._asset_resolution_handlers._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&usdz_asset.size);
      tinyusdz::tydra::RenderSceneConverterEnv::~RenderSceneConverterEnv
                ((RenderSceneConverterEnv *)((long)&usd_basedir.field_2 + 8));
      tinyusdz::tydra::RenderSceneConverter::~RenderSceneConverter
                ((RenderSceneConverter *)&env.tinterp);
      tinyusdz::tydra::RenderScene::~RenderScene
                ((RenderScene *)((long)&converter._warn.field_2 + 8));
    }
    tinyusdz::Stage::~Stage((Stage *)local_1730);
    std::__cxx11::string::~string((string *)&stage._prim_id_allocator.dirty_);
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
LAB_001297e1:
    std::__cxx11::string::~string((string *)local_48);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "Usage: " << argv[0] << " input.usd [OPTIONS].\n";
    std::cout << "\n\nOptions\n\n";
    std::cout << "  --timecode VALUE: Specify timecode value(e.g. 3.14)\n";
    std::cout << "  --noidxbuild: Do not rebuild vertex indices\n";
    std::cout << "  --notri: Do not triangulate mesh\n";
    std::cout << "  --nousdprint: Do not print parsed USD\n";
    std::cout
        << "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n";
    std::cout << "  --dumpusd: Dump scene as USD(USDA Ascii)\n";
    return EXIT_FAILURE;
  }

  // When Xform, Mesh, Material, etc. have time-varying values,
  // values are evaluated at `timecode` time(except for animation values in
  // SkelAnimation)
  double timecode = tinyusdz::value::TimeCode::Default();

  bool build_indices = true;
  bool triangulate = true;
  bool export_obj = false;
  bool export_usd = false;
  bool no_usdprint = false;

  std::string filepath;
  for (int i = 1; i < argc; i++) {
    if (strcmp(argv[i], "--notri") == 0) {
      triangulate = false;
    } else if (strcmp(argv[i], "--noidxbuild") == 0) {
      build_indices = false;
    } else if (strcmp(argv[i], "--nousdprint") == 0) {
      no_usdprint = true;
    } else if (strcmp(argv[i], "--dumpobj") == 0) {
      export_obj = true;
    } else if (strcmp(argv[i], "--dumpusd") == 0) {
      export_usd = true;
    } else if (strcmp(argv[i], "--timecode") == 0) {
      if ((i + 1) >= argc) {
        std::cerr << "arg is missing for --timecode flag.\n";
        return -1;
      }
      timecode = std::stod(argv[i + 1]);
      std::cout << "Use timecode: " << timecode << "\n";
      i++;
    } else {
      filepath = argv[i];
    }
  }

  std::string warn;
  std::string err;

  tinyusdz::Stage stage;

  if (!tinyusdz::IsUSD(filepath)) {
    std::cerr << "File not found or not a USD format: " << filepath << "\n";
  }

  bool ret = tinyusdz::LoadUSDFromFile(filepath, &stage, &warn, &err);
  if (!warn.empty()) {
    std::cerr << "WARN : " << warn << "\n";
  }

  if (!err.empty()) {
    std::cerr << "ERR : " << err << "\n";
  }

  if (!ret) {
    std::cerr << "Failed to load USD file: " << filepath << "\n";
    return EXIT_FAILURE;
  }

  bool is_usdz = tinyusdz::IsUSDZ(filepath);

  if (!no_usdprint) {
    std::string s = stage.ExportToString();
    std::cout << s << "\n";
    std::cout << "--------------------------------------"
              << "\n";
  }

  // RenderScene: Scene graph object which is suited for GL/Vulkan renderer
  tinyusdz::tydra::RenderScene render_scene;
  tinyusdz::tydra::RenderSceneConverter converter;
  tinyusdz::tydra::RenderSceneConverterEnv env(stage);

  std::cout << "Triangulate : " << (triangulate ? "true" : "false") << "\n";
  env.mesh_config.triangulate = triangulate;
  std::cout << "Rebuild vertex indices : " << (build_indices ? "true" : "false")
            << "\n";
  env.mesh_config.build_vertex_indices = build_indices;

  // Add base directory of .usd file to search path.
  std::string usd_basedir = tinyusdz::io::GetBaseDir(filepath);
  std::cout << "Add seach path: " << usd_basedir << "\n";

  tinyusdz::USDZAsset usdz_asset;
  if (is_usdz) {
    // Setup AssetResolutionResolver to read a asset(file) from memory.
    if (!tinyusdz::ReadUSDZAssetInfoFromFile(filepath, &usdz_asset, &warn,
                                             &err)) {
      std::cerr << "Failed to read USDZ assetInfo from file: " << err << "\n";
      exit(-1);
    }
    if (warn.size()) {
      std::cout << warn << "\n";
    }

    tinyusdz::AssetResolutionResolver arr;

    // NOTE: Pointer address of usdz_asset must be valid until the call of
    // RenderSceneConverter::ConvertToRenderScene.
    if (!tinyusdz::SetupUSDZAssetResolution(arr, &usdz_asset)) {
      std::cerr << "Failed to setup AssetResolution for USDZ asset\n";
      exit(-1);
    };

    env.asset_resolver = arr;

  } else {
    env.set_search_paths({usd_basedir});

    // TODO: Add example to set user-defined AssetResolutionResolver
    // AssetResolutionResolver arr;
    // ...
    // env.asset_resolver(arr);
  }

  if (!tinyusdz::value::TimeCode(timecode).is_default()) {
    std::cout << "Use timecode : " << timecode << "\n";
  }
  env.timecode = timecode;
  ret = converter.ConvertToRenderScene(env, &render_scene);
  if (!ret) {
    std::cerr << "Failed to convert USD Stage to RenderScene: \n"
              << converter.GetError() << "\n";
    return EXIT_FAILURE;
  }

  if (converter.GetWarning().size()) {
    std::cout << "ConvertToRenderScene warn: " << converter.GetWarning()
              << "\n";
  }

  std::cout << DumpRenderScene(render_scene) << "\n";

  if (export_obj) {
    std::cout << "Dump RenderMesh as wavefront .obj\n";
    for (size_t i = 0; i < render_scene.meshes.size(); i++) {
      std::string obj_str;
      std::string mtl_str;
      if (!tinyusdz::tydra::export_to_obj(render_scene, i, obj_str, mtl_str,
                                          &warn, &err)) {
        std::cerr << "obj export error: " << err << "\n";
        exit(-1);
      }

      std::string obj_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".obj";
      std::string mtl_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".mtl";
      {
        std::ofstream obj_ofs(obj_filename);
        obj_ofs << obj_str;
      }

      {
        std::ofstream mtl_ofs(mtl_filename);
        mtl_ofs << mtl_str;
      }
      std::cout << "  Wrote " << obj_filename << "\n";
    }
  }

  if (export_usd) {
    std::string ext = tinyusdz::io::GetFileExtension(filepath);
    std::string usd_basename = tinyusdz::io::GetBaseFilename(filepath);
    std::string usd_filename =
        tinyusdz::removeSuffix(usd_basename, ext) + "export.usda";

    std::string usda_str;
    if (!tinyusdz::tydra::export_to_usda(render_scene, usda_str, &warn, &err)) {
      std::cerr << "Failed to export RenderScene to USDA: " << err << "\n";
    }
    if (warn.size()) {
      std::cout << "WARN: " << warn << "\n";
    }

    {
      std::ofstream ofs(usd_filename);
      ofs << usda_str;
    }
    std::cout << "Exported RenderScene as USDA: " << usd_filename << "\n";
  }

  return EXIT_SUCCESS;
}